

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O0

void __thiscall
helics::CommsInterface::loadNetworkInfo(CommsInterface *this,NetworkBrokerData *netInfo)

{
  bool bVar1;
  CommsInterface *this_00;
  long in_RSI;
  CommsInterface *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  bVar1 = propertyLock(in_RDI);
  if (bVar1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    in_RDI->interfaceNetwork = *(InterfaceNetworks *)(in_RSI + 0xbc);
    in_RDI->maxMessageSize = *(int *)(in_RSI + 0xb0);
    in_RDI->maxMessageCount = *(int *)(in_RSI + 0xb4);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    in_RDI->autoBroker = (bool)(*(byte *)(in_RSI + 0xbf) & 1);
    in_RDI->observer = (bool)(*(byte *)(in_RSI + 0xc3) & 1);
    this_00 = (CommsInterface *)(ulong)*(byte *)(in_RSI + 0xc4);
    switch(this_00) {
    case (CommsInterface *)0x0:
      break;
    case (CommsInterface *)0x1:
    case (CommsInterface *)0x3:
      in_RDI->serverMode = true;
      break;
    case (CommsInterface *)0x2:
    case (CommsInterface *)0x4:
      in_RDI->serverMode = false;
    }
    if ((in_RDI->mRequireBrokerConnection & 1U) == 0) {
      bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4dd5de);
      if ((bVar1) &&
         (bVar1 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x4dd5f5), !bVar1)) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                  in_stack_ffffffffffffffd8);
      }
    }
    else {
      bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4dd593);
      if ((bVar1) &&
         (bVar1 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x4dd5aa), !bVar1)) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                  in_stack_ffffffffffffffd8);
      }
    }
    propertyUnLock(this_00);
  }
  return;
}

Assistant:

void CommsInterface::loadNetworkInfo(const NetworkBrokerData& netInfo)
{
    if (propertyLock()) {
        localTargetAddress = netInfo.localInterface;
        brokerTargetAddress = netInfo.brokerAddress;
        brokerName = netInfo.brokerName;
        interfaceNetwork = netInfo.interfaceNetwork;
        maxMessageSize = netInfo.maxMessageSize;
        maxMessageCount = netInfo.maxMessageCount;
        brokerInitString = netInfo.brokerInitString;
        autoBroker = netInfo.autobroker;
        observer = netInfo.observer;
        switch (netInfo.server_mode) {
            case NetworkBrokerData::ServerModeOptions::SERVER_ACTIVE:
            case NetworkBrokerData::ServerModeOptions::SERVER_DEFAULT_ACTIVE:
                serverMode = true;
                break;
            case NetworkBrokerData::ServerModeOptions::SERVER_DEACTIVATED:
            case NetworkBrokerData::ServerModeOptions::SERVER_DEFAULT_DEACTIVATED:
                serverMode = false;
                break;
            case NetworkBrokerData::ServerModeOptions::UNSPECIFIED:
                break;
        }
        if (mRequireBrokerConnection) {
            if (brokerTargetAddress.empty() && !netInfo.connectionAddress.empty()) {
                brokerTargetAddress = netInfo.connectionAddress;
            }
        } else {
            if (localTargetAddress.empty() && !netInfo.connectionAddress.empty()) {
                localTargetAddress = netInfo.connectionAddress;
            }
        }
        propertyUnLock();
    }
}